

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serve_dynamic_content.hpp
# Opt level: O2

error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
* __thiscall
pstore::http::
serve_dynamic_content<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
           *__return_storage_ptr__,http *this,
          _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
          *sender,reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  io,string *uri)

{
  descriptor<pstore::details::posix_descriptor_traits> dVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  descriptor<pstore::details::posix_descriptor_traits> dVar5;
  container *pcVar6;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>_(pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<const_unsigned_char,__1L>_&),_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  *__lhs;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>_(pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<const_unsigned_char,__1L>_&),_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  *ppVar7;
  anon_class_1_0_00000001 local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> command;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>_(pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<const_unsigned_char,__1L>_&),_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  local_a0;
  query_container arguments;
  
  std::__cxx11::string::string((string *)&local_a0,"/cmd/",(allocator *)&arguments);
  bVar2 = details::starts_with((string *)io._M_data,&local_a0.first);
  if (!bVar2) {
    assert_failed("details::starts_with (uri, dynamic_path)",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/http/serve_dynamic_content.hpp"
                  ,0x7b);
  }
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::erase(io._M_data,*io._M_data,(long)*io._M_data + 5);
  uVar3 = std::__cxx11::string::find((char)io._M_data,0x3f);
  std::__cxx11::string::substr((ulong)&command,(ulong)io._M_data);
  dVar1 = *io._M_data;
  if (uVar3 == 0xffffffffffffffff) {
    dVar5 = io._M_data[1];
    begin._M_current = (char *)((long)dVar1 + (long)dVar5);
  }
  else {
    uVar4 = 0x7ffffffffffffffe;
    if (uVar3 < 0x7ffffffffffffffe) {
      uVar4 = uVar3;
    }
    begin._M_current = (char *)((long)dVar1 + uVar4 + 1);
    dVar5 = io._M_data[1];
  }
  arguments._M_h._M_buckets = &arguments._M_h._M_single_bucket;
  arguments._M_h._M_bucket_count = 1;
  arguments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  arguments._M_h._M_element_count = 0;
  arguments._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  arguments._M_h._M_rehash_policy._M_next_resize = 0;
  arguments._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (begin._M_current != (char *)((long)dVar1 + (long)dVar5)) {
    query_to_kvp<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,pstore::http::insert_iterator<std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>>
              (begin,(char *)((long)dVar1 + (long)dVar5),&arguments);
  }
  pcVar6 = details::
           get_commands<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                     ();
  ppVar7 = pcVar6[1]._M_elems;
  bVar2 = std::
          is_sorted<std::pair<std::__cxx11::string,std::function<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>(pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)>>const*,pstore::http::serve_dynamic_content<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore___ing>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)>>const___1_>
                    (pcVar6,ppVar7);
  if (!bVar2) {
    assert_failed("std::is_sorted (std::begin (commands), std::end (commands), compare)",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/http/serve_dynamic_content.hpp"
                  ,0x91);
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>_(pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<const_unsigned_char,_-1L>_&),_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  ::
  pair<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_http_serve_dynamic_content_hpp:149:37),_true>
            (&local_a0,&command,&local_c1);
  __lhs = std::
          __lower_bound<std::pair<std::__cxx11::string,std::function<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>(pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)>>const*,std::pair<std::__cxx11::string,std::function<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>(pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_de___ng>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)>>const___1_>>
                    (pcVar6,ppVar7,&local_a0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>_(pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<const_unsigned_char,_-1L>_&),_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  ::~pair(&local_a0);
  if (__lhs != ppVar7) {
    bVar2 = std::operator!=(&__lhs->first,&command);
    if (!bVar2) {
      std::
      function<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>_(pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<const_unsigned_char,_-1L>_&),_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
      ::operator()(__return_storage_ptr__,&__lhs->second,
                   (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                    *)this,(reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                            )sender,&arguments);
      goto LAB_0010ee42;
    }
  }
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
  ::error_or<pstore::http::error_code,void>
            ((error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
              *)__return_storage_ptr__,bad_request);
LAB_0010ee42:
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&arguments._M_h);
  std::__cxx11::string::~string((string *)&command);
  return __return_storage_ptr__;
}

Assistant:

error_or<IO> serve_dynamic_content (Sender sender, IO io, std::string uri) {

            // Remove the common path prefix from the URI.
            PSTORE_ASSERT (details::starts_with (uri, dynamic_path));
            uri.erase (std::begin (uri),
                       std::begin (uri) + pstore::array_elements (dynamic_path) - 1U);

            // Extract the command name and any query argument, if we have them.
            auto const pos = uri.find ('?');
            auto const command = uri.substr (0, pos);
            auto it = pos != std::string::npos
                          ? std::begin (uri) + details::clamp_to_signed_max (pos + 1)
                          : std::end (uri);
            query_container arguments;
            if (it != std::end (uri)) {
                it = query_to_kvp (it, std::end (uri),
                                   pstore::http::make_insert_iterator (arguments));
            }

            // Do we know how to handle this command?
            auto const & commands = details::get_commands<Sender, IO> ();
            using value_type = typename details::commands_helper<Sender, IO>::container::value_type;
            auto const compare = [] (value_type const & a, value_type const & b) {
                return std::get<0> (a) < std::get<0> (b);
            };
            PSTORE_ASSERT (std::is_sorted (std::begin (commands), std::end (commands), compare));

            auto const lb = std::lower_bound (
                std::begin (commands), std::end (commands),
                value_type{command, [] (Sender, IO io2,
                                        query_container const &) { return error_or<IO>{io2}; }},
                compare);
            if (lb == std::end (commands) || std::get<0> (*lb) != command) {
                return error_or<IO>{error_code::bad_request};
            }

            // Yep, this is a command we understand. Call it.
            return std::get<1> (*lb) (sender, io, arguments);
        }